

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint __thiscall kj::_::HashCoder::operator*(HashCoder *this,RawSchema *ptr)

{
  uint uVar1;
  RawSchema *ptr_local;
  HashCoder *this_local;
  
  uVar1 = intHash64((uint64_t)ptr);
  return uVar1;
}

Assistant:

uint operator*(T* ptr) const {
    static_assert(!isSameType<Decay<T>, char>(), "Wrap in StringPtr if you want to hash string "
        "contents. If you want to hash the pointer, cast to void*");
    if constexpr (sizeof(ptr) == sizeof(uint32_t)) {
      return intHash32(reinterpret_cast<uint32_t>(ptr));
    } else {
      return intHash64(reinterpret_cast<uint64_t>(ptr));
    }
  }